

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

boxptr find_biggest_volume(boxptr boxlist,int numboxes)

{
  boxptr which;
  JLONG maxv;
  int i;
  boxptr boxp;
  int numboxes_local;
  boxptr boxlist_local;
  
  maxv = 0;
  which = (boxptr)0x0;
  boxp = boxlist;
  for (i = 0; i < numboxes; i = i + 1) {
    if (maxv < boxp->volume) {
      which = boxp;
      maxv = boxp->volume;
    }
    boxp = boxp + 1;
  }
  return which;
}

Assistant:

LOCAL(boxptr)
find_biggest_volume(boxptr boxlist, int numboxes)
/* Find the splittable box with the largest (scaled) volume */
/* Returns NULL if no splittable boxes remain */
{
  register boxptr boxp;
  register int i;
  register JLONG maxv = 0;
  boxptr which = NULL;

  for (i = 0, boxp = boxlist; i < numboxes; i++, boxp++) {
    if (boxp->volume > maxv) {
      which = boxp;
      maxv = boxp->volume;
    }
  }
  return which;
}